

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

double __thiscall
node::anon_unknown_2::ChainImpl::guessVerificationProgress(ChainImpl *this,uint256 *block_hash)

{
  CChainParams *pCVar1;
  ChainstateManager *pCVar2;
  CBlockIndex *pindex;
  long in_FS_OFFSET;
  double dVar3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x27d,false);
  pCVar2 = chainman(this);
  pCVar1 = (pCVar2->m_options).chainparams;
  pCVar2 = chainman(this);
  pindex = BlockManager::LookupBlockIndex(&pCVar2->m_blockman,block_hash);
  dVar3 = GuessVerificationProgress(&pCVar1->chainTxData,pindex);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return dVar3;
  }
  __stack_chk_fail();
}

Assistant:

double guessVerificationProgress(const uint256& block_hash) override
    {
        LOCK(::cs_main);
        return GuessVerificationProgress(chainman().GetParams().TxData(), chainman().m_blockman.LookupBlockIndex(block_hash));
    }